

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcServiceLife::IfcServiceLife(IfcServiceLife *this)

{
  *(undefined ***)&this->field_0x118 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x120 = 0;
  *(char **)&this->field_0x128 = "IfcServiceLife";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__007f0bd8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7f0af8;
  *(undefined8 *)&this->field_0x118 = 0x7f0bc0;
  *(undefined8 *)&this->field_0x88 = 0x7f0b20;
  *(undefined8 *)&this->field_0x98 = 0x7f0b48;
  *(undefined8 *)&this->field_0xd0 = 0x7f0b70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x7f0b98;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcServiceLife() : Object("IfcServiceLife") {}